

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.cpp
# Opt level: O1

void __thiscall
VulkanUtilities::VulkanSyncObjectManager::Recycle
          (VulkanSyncObjectManager *this,VkSemaphoreType vkSem,bool IsUnsignaled)

{
  pointer *pppVVar1;
  iterator __position;
  int iVar2;
  undefined7 in_register_00000011;
  VkSemaphore_T *local_18;
  
  local_18 = vkSem.Value;
  if ((int)CONCAT71(in_register_00000011,IsUnsignaled) == 0) {
    (*vkDestroySemaphore)
              (this->m_LogicalDevice->m_VkDevice,vkSem.Value,(VkAllocationCallbacks *)0x0);
    return;
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_SemaphorePoolGuard);
  if (iVar2 == 0) {
    __position._M_current =
         (this->m_SemaphorePool).
         super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_SemaphorePool).
        super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::
      _M_realloc_insert<VkSemaphore_T*const&>
                ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)&this->m_SemaphorePool,
                 __position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      pppVVar1 = &(this->m_SemaphorePool).
                  super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppVVar1 = *pppVVar1 + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_SemaphorePoolGuard);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void VulkanSyncObjectManager::Recycle(VkSemaphoreType vkSem, bool IsUnsignaled)
{
    // Can not reuse semaphore in signaled state
    if (!IsUnsignaled)
    {
        vkDestroySemaphore(m_LogicalDevice.GetVkDevice(), vkSem.Value, nullptr);
        return;
    }

    std::lock_guard<std::mutex> Lock{m_SemaphorePoolGuard};
    m_SemaphorePool.push_back(vkSem.Value);
}